

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O2

int SSL_set1_sigalgs(SSL *ssl,int *values,size_t num_values)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Array<unsigned_short> sigalgs;
  
  if ((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl == (SSL_CONFIG *)0x0) {
    iVar3 = 0;
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0x2af);
  }
  else {
    sigalgs.data_ = (unsigned_short *)0x0;
    sigalgs.size_ = 0;
    bVar1 = parse_sigalg_pairs(&sigalgs,values,num_values);
    iVar3 = 0;
    if (bVar1) {
      iVar2 = SSL_set_signing_algorithm_prefs(ssl,sigalgs.data_,sigalgs.size_);
      iVar3 = 0;
      if (iVar2 != 0) {
        iVar3 = SSL_set_verify_algorithm_prefs(ssl,sigalgs.data_,sigalgs.size_);
      }
    }
    bssl::Array<unsigned_short>::~Array(&sigalgs);
  }
  return iVar3;
}

Assistant:

int SSL_set1_sigalgs(SSL *ssl, const int *values, size_t num_values) {
  if (!ssl->config) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  Array<uint16_t> sigalgs;
  if (!parse_sigalg_pairs(&sigalgs, values, num_values)) {
    return 0;
  }

  if (!SSL_set_signing_algorithm_prefs(ssl, sigalgs.data(), sigalgs.size()) ||
      !SSL_set_verify_algorithm_prefs(ssl, sigalgs.data(), sigalgs.size())) {
    return 0;
  }

  return 1;
}